

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.inc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::GeneratedMessageTest_CopyConstructorWithArenas_Test::
TestBody(GeneratedMessageTest_CopyConstructorWithArenas_Test *this)

{
  TestAllTypes *message;
  TestAllTypes *this_00;
  type pTVar1;
  unique_ptr<proto2_unittest::TestAllTypes,_std::default_delete<proto2_unittest::TestAllTypes>_>
  local_418;
  unique_ptr<proto2_unittest::TestAllTypes,_std::default_delete<proto2_unittest::TestAllTypes>_>
  message2_heap;
  TestAllTypes message2_stack;
  TestAllTypes *message1;
  Arena arena;
  GeneratedMessageTest_CopyConstructorWithArenas_Test *this_local;
  
  arena.impl_.first_arena_.cached_blocks_ = (CachedBlock **)this;
  Arena::Arena((Arena *)&message1);
  message = Arena::Create<proto2_unittest::TestAllTypes>((Arena *)&message1);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(message);
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)&message2_heap,message);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>((TestAllTypes *)&message2_heap);
  this_00 = (TestAllTypes *)operator_new(0x340);
  proto2_unittest::TestAllTypes::TestAllTypes(this_00,message);
  std::unique_ptr<proto2_unittest::TestAllTypes,std::default_delete<proto2_unittest::TestAllTypes>>
  ::unique_ptr<std::default_delete<proto2_unittest::TestAllTypes>,void>
            ((unique_ptr<proto2_unittest::TestAllTypes,std::default_delete<proto2_unittest::TestAllTypes>>
              *)&local_418,this_00);
  pTVar1 = std::
           unique_ptr<proto2_unittest::TestAllTypes,_std::default_delete<proto2_unittest::TestAllTypes>_>
           ::operator*(&local_418);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(pTVar1);
  Arena::Reset((Arena *)&message1);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>((TestAllTypes *)&message2_heap);
  pTVar1 = std::
           unique_ptr<proto2_unittest::TestAllTypes,_std::default_delete<proto2_unittest::TestAllTypes>_>
           ::operator*(&local_418);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(pTVar1);
  std::
  unique_ptr<proto2_unittest::TestAllTypes,_std::default_delete<proto2_unittest::TestAllTypes>_>::
  ~unique_ptr(&local_418);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)&message2_heap);
  Arena::~Arena((Arena *)&message1);
  return;
}

Assistant:

TEST(GENERATED_MESSAGE_TEST_NAME, CopyConstructorWithArenas) {
  Arena arena;
  UNITTEST::TestAllTypes* message1 =
      Arena::Create<UNITTEST::TestAllTypes>(&arena);
  TestUtil::SetAllFields(message1);

  UNITTEST::TestAllTypes message2_stack(*message1);
  TestUtil::ExpectAllFieldsSet(message2_stack);

  std::unique_ptr<UNITTEST::TestAllTypes> message2_heap(
      new UNITTEST::TestAllTypes(*message1));
  TestUtil::ExpectAllFieldsSet(*message2_heap);

  arena.Reset();

  // Verify that the copies are still intact.
  TestUtil::ExpectAllFieldsSet(message2_stack);
  TestUtil::ExpectAllFieldsSet(*message2_heap);
}